

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::cache_e(size_t prec)

{
  ulong prec_00;
  char *pcVar1;
  size_t sVar2;
  long in_RDI;
  char *ext;
  int expanded;
  char *in_stack_000001e0;
  char *in_stack_000001e8;
  size_t in_stack_ffffffffffffffc8;
  CVmBigNumCache *in_stack_ffffffffffffffd0;
  int local_14;
  
  prec_00 = in_RDI + 7U & 0xfffffffffffffff8;
  calc_alloc(prec_00);
  pcVar1 = CVmBigNumCache::get_e_reg
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int *)0x30cd66);
  if (pcVar1 != (char *)0x0) {
    if ((local_14 != 0) || (sVar2 = get_prec((char *)0x30cd8e), sVar2 < prec_00)) {
      set_prec((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      get_one();
      compute_exp_into(in_stack_000001e8,in_stack_000001e0);
    }
    return pcVar1;
  }
  err_throw(0);
}

Assistant:

const char *CVmObjBigNum::cache_e(size_t prec)
{
    /* 
     *   round up the precision a bit to ensure that we don't have to
     *   repeatedly recalculate this value if we're asked for a cluster of
     *   similar precisions 
     */
    prec = (prec + 7) & ~7;

    /* get the e cache register */
    int expanded;
    char *ext = S_bignum_cache->get_e_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   if we didn't have to allocate more memory, and the value in the
     *   register has at least the required precision, return the cached
     *   value 
     */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* 
     *   we have reallocated the register, or we just didn't have enough
     *   precision in the old value - set the new precision 
     */
    set_prec(ext, prec);

    /* exponentiate the base of the natural logarithm to the power 1 */
    compute_exp_into(ext, get_one());

    /* return the register pointer */
    return ext;
}